

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCo.c
# Opt level: O2

Gia_Man_t * Gia_PolynCoreDetectTest(Gia_Man_t *pGia,int fAddExtra,int fAddCones,int fVerbose)

{
  Vec_Int_t *vAddCos;
  Gia_Man_t *pGVar1;
  
  if (fAddExtra == 0) {
    vAddCos = Vec_IntAlloc(0);
  }
  else {
    vAddCos = Gia_PolynAddHaRoots(pGia);
  }
  pGVar1 = Gia_PolynCoreDetectTest_int(pGia,vAddCos,fAddCones,fVerbose);
  printf("On top of %d COs, created %d new adder outputs.\n",(ulong)(uint)pGia->vCos->nSize,
         (ulong)(uint)vAddCos->nSize);
  Vec_IntFree(vAddCos);
  return pGVar1;
}

Assistant:

Gia_Man_t * Gia_PolynCoreDetectTest( Gia_Man_t * pGia, int fAddExtra, int fAddCones, int fVerbose )
{
    Vec_Int_t * vAddCos = fAddExtra ? Gia_PolynAddHaRoots( pGia ) : Vec_IntAlloc(0);
    Gia_Man_t * pNew = Gia_PolynCoreDetectTest_int( pGia, vAddCos, fAddCones, fVerbose );
    printf( "On top of %d COs, created %d new adder outputs.\n", Gia_ManCoNum(pGia), Vec_IntSize(vAddCos) );
    Vec_IntFree( vAddCos );
    return pNew;
}